

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plibraryloader-posix.c
# Opt level: O2

pchar * p_library_loader_get_last_error(PLibraryLoader *loader)

{
  pchar *ppVar1;
  
  ppVar1 = (pchar *)dlerror();
  if (ppVar1 != (pchar *)0x0) {
    ppVar1 = p_strdup(ppVar1);
    return ppVar1;
  }
  return (pchar *)0x0;
}

Assistant:

P_LIB_API pchar *
p_library_loader_get_last_error (PLibraryLoader *loader)
{
	pchar		*res = NULL;
	const pchar	*msg;

	P_UNUSED (loader);

	msg = dlerror ();

	if (msg != NULL)
		res = p_strdup (msg);

	return res;
}